

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int lls_qr(double *Ai,double *bi,int M,int N,double *xo)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *__ptr;
  ulong uVar9;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int n;
  double *pdVar20;
  uint uVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  void *pvVar25;
  double dVar26;
  ulong local_b8;
  
  lVar22 = (long)N;
  lVar3 = (long)M;
  if (M < N) {
    sVar23 = lVar22 * lVar3 * 8;
    pdVar4 = (double *)malloc(sVar23);
    sVar1 = lVar3 * 8;
    pdVar5 = (double *)malloc(sVar1);
    pdVar6 = (double *)malloc(sVar23);
    pdVar7 = (double *)malloc(sVar1 * lVar3);
    pdVar8 = (double *)malloc(sVar1);
    __ptr = (double *)malloc(sVar1);
    uVar9 = 0;
    uVar10 = 0;
    if (0 < M) {
      uVar10 = (ulong)(uint)M;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      __ptr[uVar9] = bi[uVar9];
    }
    mtranspose(Ai,M,N,pdVar4);
    qrdecomp(pdVar4,N,M,pdVar5);
    getQR(pdVar4,N,M,pdVar5,pdVar6,pdVar7);
    iVar2 = rank(pdVar7,M,M);
    itranspose(pdVar7,M,M);
    *pdVar8 = *__ptr / *pdVar7;
    pdVar12 = pdVar7;
    for (lVar22 = 1; pdVar12 = pdVar12 + lVar3, lVar22 < lVar3; lVar22 = lVar22 + 1) {
      dVar26 = 0.0;
      for (lVar17 = 0; lVar22 != lVar17; lVar17 = lVar17 + 1) {
        dVar26 = dVar26 + pdVar12[lVar17] * pdVar8[lVar17];
      }
      pdVar8[lVar22] = (__ptr[lVar22] - dVar26) / pdVar7[lVar22 * lVar3 + lVar22];
    }
    mmult(pdVar6,pdVar8,xo,N,M,1);
    free(pdVar4);
    free(pdVar5);
    free(pdVar6);
    free(pdVar7);
    free(pdVar8);
  }
  else {
    sVar1 = lVar3 * 8;
    pdVar4 = (double *)malloc(sVar1);
    __ptr_00 = malloc(sVar1);
    sVar23 = lVar22 * 8;
    __ptr_01 = malloc(sVar23);
    pdVar5 = (double *)malloc(sVar1);
    pdVar6 = (double *)malloc(sVar1 * lVar22);
    __ptr = (double *)malloc(sVar1 * lVar22);
    pdVar7 = (double *)malloc(sVar23);
    pdVar8 = (double *)malloc(sVar23 * lVar22);
    uVar9 = 0;
    uVar10 = 0;
    if (0 < M) {
      uVar10 = (ulong)(uint)M;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(double *)((long)__ptr_00 + uVar9 * 8) = bi[uVar9];
    }
    uVar10 = 0;
    uVar9 = (ulong)(uint)(N * M);
    if (N * M < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      __ptr[uVar10] = Ai[uVar10];
    }
    uVar10 = 0;
    uVar9 = 0;
    if (0 < N) {
      uVar9 = (ulong)(uint)N;
    }
    local_b8 = (ulong)(uint)M;
    pdVar12 = __ptr + lVar22;
    uVar14 = local_b8;
    pdVar20 = __ptr;
    uVar24 = (ulong)(uint)N;
    while( true ) {
      uVar21 = (uint)uVar10;
      iVar16 = M - uVar21;
      uVar15 = uVar21;
      if (iVar16 != 0 && (int)uVar21 <= M) {
        uVar15 = M;
      }
      if (uVar10 == uVar9) break;
      pdVar13 = pdVar20;
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        pdVar4[uVar11] = *pdVar13;
        pdVar13 = pdVar13 + lVar22;
      }
      dVar26 = house(pdVar4,iVar16,pdVar5);
      *(double *)((long)__ptr_01 + uVar10 * 8) = dVar26;
      lVar17 = 0;
      pdVar13 = pdVar20;
      for (uVar11 = uVar10; uVar11 != uVar15; uVar11 = uVar11 + 1) {
        lVar18 = lVar17;
        for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
          *(double *)((long)pdVar6 + (lVar18 >> 0x1d)) = pdVar13[uVar19];
          lVar18 = lVar18 + (uVar14 << 0x20);
        }
        pdVar13 = pdVar13 + lVar22;
        lVar17 = lVar17 + 0x100000000;
      }
      iVar2 = N - uVar21;
      mmult(pdVar6,pdVar5,pdVar7,iVar2,iVar16,1);
      scale(pdVar7,iVar2,1,dVar26);
      mmult(pdVar5,pdVar7,pdVar6,iVar16,1,iVar2);
      lVar17 = 0;
      pdVar13 = pdVar20;
      for (uVar11 = uVar10; uVar11 != uVar15; uVar11 = uVar11 + 1) {
        for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
          pdVar13[uVar19] = pdVar13[uVar19] - pdVar6[(int)lVar17 + (int)uVar19];
        }
        pdVar13 = pdVar13 + lVar22;
        lVar17 = lVar17 + uVar24;
      }
      pdVar13 = pdVar12;
      for (lVar17 = 1; (long)(uVar10 + lVar17) < lVar3; lVar17 = lVar17 + 1) {
        *pdVar13 = pdVar5[lVar17];
        pdVar13 = pdVar13 + lVar22;
      }
      uVar10 = uVar10 + 1;
      uVar14 = uVar14 - 1;
      pdVar20 = pdVar20 + lVar22 + 1;
      uVar24 = uVar24 - 1;
      pdVar12 = pdVar12 + lVar22 + 1;
    }
    pdVar12 = __ptr;
    pdVar20 = pdVar8;
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      for (uVar14 = 0; (uint)N != uVar14; uVar14 = uVar14 + 1) {
        if (uVar14 < uVar10) {
          pdVar20[uVar14] = 0.0;
        }
        else {
          pdVar20[uVar14] = pdVar12[uVar14];
        }
      }
      pdVar20 = pdVar20 + lVar22;
      pdVar12 = pdVar12 + lVar22;
    }
    iVar2 = rank(pdVar8,N,N);
    lVar17 = 0;
    uVar10 = 0;
    iVar16 = 1;
    pdVar12 = __ptr;
    pvVar25 = __ptr_00;
    pdVar20 = pdVar5;
    while( true ) {
      n = M - (int)uVar10;
      uVar14 = uVar10 & 0xffffffff;
      if (n != 0 && (int)uVar10 <= M) {
        uVar14 = (ulong)(uint)M;
      }
      if (uVar10 == uVar9) break;
      lVar18 = (long)iVar16;
      pdVar13 = (double *)(sVar23 * lVar18 + (long)pdVar12);
      pdVar5[uVar10] = 1.0;
      for (; lVar18 < lVar3; lVar18 = lVar18 + 1) {
        pdVar5[lVar18] = *pdVar13;
        pdVar13 = pdVar13 + lVar22;
      }
      mmult((double *)((long)__ptr_00 + uVar10 * 8),pdVar5 + uVar10,pdVar7,1,n,1);
      dVar26 = *pdVar7 * *(double *)((long)__ptr_01 + uVar10 * 8);
      *pdVar7 = dVar26;
      for (lVar18 = 0; uVar14 + lVar17 != lVar18; lVar18 = lVar18 + 1) {
        pdVar20[lVar18] = pdVar20[lVar18] * dVar26;
      }
      for (uVar14 = 0; local_b8 != uVar14; uVar14 = uVar14 + 1) {
        *(double *)((long)pvVar25 + uVar14 * 8) =
             *(double *)((long)pvVar25 + uVar14 * 8) - pdVar20[uVar14];
      }
      uVar10 = uVar10 + 1;
      iVar16 = iVar16 + 1;
      pdVar12 = pdVar12 + 1;
      pdVar20 = pdVar20 + 1;
      lVar17 = lVar17 + -1;
      pvVar25 = (void *)((long)pvVar25 + 8);
      local_b8 = local_b8 - 1;
    }
    iVar16 = N + -1;
    xo[iVar16] = *(double *)((long)__ptr_00 + (long)iVar16 * 8) / pdVar8[(ulong)(uint)(N * N) - 1];
    uVar9 = (ulong)(N + -2);
    lVar3 = (long)(N + 1);
    pdVar12 = pdVar8 + uVar9 * lVar3 + 1;
    for (; -1 < (long)uVar9; uVar9 = uVar9 - 1) {
      dVar26 = 0.0;
      for (lVar22 = 0; iVar16 + (int)lVar22 < N; lVar22 = lVar22 + 1) {
        dVar26 = dVar26 + pdVar12[lVar22] * xo[(uVar9 & 0xffffffff) + lVar22 + 1];
      }
      xo[uVar9] = (*(double *)((long)__ptr_00 + uVar9 * 8) - dVar26) / pdVar8[uVar9 * lVar3];
      iVar16 = iVar16 + -1;
      pdVar12 = pdVar12 + -lVar3;
    }
    free(pdVar4);
    free(pdVar5);
    free(pdVar6);
    free(pdVar7);
    free(__ptr_01);
    free(pdVar8);
    free(__ptr_00);
  }
  free(__ptr);
  return iVar2;
}

Assistant:

int lls_qr(double *Ai,double *bi,int M,int N,double *xo) {
	int ret;

	if (M >= N) {
		ret = lls_qr_determined(Ai,bi,M,N,xo);
	} else {
		ret = lls_qr_undetermined(Ai,bi,M,N,xo);
	}

	return ret;
}